

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.h
# Opt level: O0

bool __thiscall RoomInfo::operator==(RoomInfo *this,RoomInfo *room)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  RoomInfo *local_18;
  RoomInfo *room_local;
  RoomInfo *this_local;
  
  local_18 = room;
  room_local = this;
  std::operator+(&local_38,&this->flatname,&this->roomname);
  std::operator+(&local_58,&local_18->flatname,&local_18->roomname);
  _Var1 = std::operator==(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

bool operator==(const RoomInfo& room) const
	{
		return flatname + roomname == room.flatname + room.roomname;
	}